

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O3

asn_strtol_result_e asn_strtol_lim(char *str,char **end,long *lp)

{
  asn_strtol_result_e aVar1;
  long lVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  
  pbVar3 = (byte *)*end;
  aVar1 = ASN_STRTOL_ERROR_INVAL;
  if (str < pbVar3) {
    uVar5 = 7;
    iVar4 = 1;
    uVar7 = 7;
    if (*str != '+') {
      if (*str != '-') goto LAB_00140e4c;
      iVar4 = -1;
      uVar7 = 8;
    }
    uVar5 = uVar7;
    str = str + 1;
    if (str < pbVar3) {
LAB_00140e4c:
      if (str < pbVar3) {
        lVar2 = (long)pbVar3 - (long)str;
        lVar6 = 0;
        do {
          if (9 < (byte)(*str - 0x30U)) {
            *end = str;
            *lp = lVar6 * iVar4;
            return ASN_STRTOL_EXTRA_DATA;
          }
          uVar7 = (byte)*str - 0x30;
          if (lVar6 < 0xccccccccccccccc) {
            lVar6 = (ulong)uVar7 + lVar6 * 10;
          }
          else {
            if ((lVar6 != 0xccccccccccccccc) || (uVar5 < uVar7)) {
              *end = str;
              return ASN_STRTOL_ERROR_RANGE;
            }
            if (iVar4 < 1) {
              lVar6 = -0x7ffffffffffffff8 - (ulong)uVar7;
              iVar4 = 1;
            }
            else {
              lVar6 = (ulong)uVar7 + 0x7ffffffffffffff8;
              iVar4 = 1;
            }
          }
          str = (char *)((byte *)str + 1);
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
      else {
        lVar6 = 0;
        pbVar3 = (byte *)str;
      }
      *end = (char *)pbVar3;
      *lp = iVar4 * lVar6;
      return ASN_STRTOL_OK;
    }
    *end = str;
    aVar1 = ASN_STRTOL_EXPECT_MORE;
  }
  return aVar1;
}

Assistant:

enum asn_strtol_result_e
asn_strtol_lim(const char *str, const char **end, long *lp) {
	int sign = 1;
	long l;

	const long upper_boundary = LONG_MAX / 10;
	long last_digit_max = LONG_MAX % 10;

	if(str >= *end) return ASN_STRTOL_ERROR_INVAL;

	switch(*str) {
	case '-':
		last_digit_max++;
		sign = -1;
		/* FALL THROUGH */
	case '+':
		str++;
		if(str >= *end) {
			*end = str;
			return ASN_STRTOL_EXPECT_MORE;
		}
	}

	for(l = 0; str < (*end); str++) {
		switch(*str) {
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34:
		case 0x35: case 0x36: case 0x37: case 0x38: case 0x39: {
			int d = *str - '0';
			if(l < upper_boundary) {
				l = l * 10 + d;
			} else if(l == upper_boundary) {
				if(d <= last_digit_max) {
					if(sign > 0) {
						l = l * 10 + d;
					} else {
						sign = 1;
						l = -l * 10 - d;
					}
				} else {
					*end = str;
					return ASN_STRTOL_ERROR_RANGE;
				}
			} else {
				*end = str;
				return ASN_STRTOL_ERROR_RANGE;
			}
		    }
		    continue;
		default:
		    *end = str;
		    *lp = sign * l;
		    return ASN_STRTOL_EXTRA_DATA;
		}
	}

	*end = str;
	*lp = sign * l;
	return ASN_STRTOL_OK;
}